

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.h
# Opt level: O0

void __thiscall Quadratic::Quadratic(Quadratic *this,HighsLp *lp_,ICrashOptions *options_)

{
  ICrashOptions *in_RDI;
  ICrashOptions *in_stack_ffffffffffffffb8;
  
  HighsLp::HighsLp(&this->lp,lp_);
  ICrashOptions::ICrashOptions(in_RDI,in_stack_ffffffffffffffb8);
  std::vector<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>::vector
            ((vector<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_> *)0x747b28);
  HighsSolution::HighsSolution((HighsSolution *)in_RDI);
  in_RDI[9].exact = false;
  in_RDI[9].breakpoints = false;
  *(undefined6 *)&in_RDI[9].field_0x1a = 0;
  in_RDI[9].log_options.log_stream = (FILE *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x747b60);
  in_RDI[9].log_options.user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  in_RDI[9].log_options.user_log_callback_data = (void *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x747b87);
  return;
}

Assistant:

Quadratic(HighsLp lp_, ICrashOptions options_)
      : lp(lp_),
        options(options_),
        lp_objective(0.0),
        quadratic_objective(0.0),
        residual_norm_2(0.0),
        mu(0.0) {}